

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O3

REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar5 = ref_cloud->n;
  if (ref_cloud->max == uVar5) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    pRVar2 = ref_cloud->global;
    if (0 < (long)ref_cloud->max) {
      pRVar2 = (REF_GLOB *)realloc(pRVar2,(long)ref_cloud->max << 3);
      ref_cloud->global = pRVar2;
    }
    if (pRVar2 == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x58,
             "ref_cloud_store","realloc ref_cloud->global NULL");
      uVar5 = ref_cloud->max;
LAB_001fdea2:
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar5,
             (long)(int)uVar5,8,(long)(int)uVar5 * 8);
      return 2;
    }
    fflush(_stdout);
    uVar5 = ref_cloud->max * ref_cloud->naux;
    pRVar3 = ref_cloud->aux;
    if (0 < (int)uVar5) {
      pRVar3 = (REF_DBL *)realloc(pRVar3,(ulong)uVar5 << 3);
      ref_cloud->aux = pRVar3;
    }
    if (pRVar3 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x5a,
             "ref_cloud_store","realloc ref_cloud->aux NULL");
      uVar5 = ref_cloud->max * ref_cloud->naux;
      goto LAB_001fdea2;
    }
    uVar5 = ref_cloud->n;
  }
  uVar4 = (ulong)uVar5;
  uVar7 = uVar5 + 1;
  uVar8 = uVar4;
  do {
    iVar6 = (int)uVar8;
    if (iVar6 < 1) {
      uVar7 = 0;
      break;
    }
    lVar9 = uVar8 - 1;
    if (ref_cloud->global[lVar9] == global) {
      iVar1 = ref_cloud->naux;
      if ((long)iVar1 < 1) {
        return 0;
      }
      pRVar3 = ref_cloud->aux;
      lVar9 = 0;
      do {
        pRVar3[(iVar6 + -1) * iVar1 + lVar9] = aux[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar1 != lVar9);
      return 0;
    }
    uVar7 = uVar7 - 1;
    uVar8 = uVar8 - 1;
  } while (global <= ref_cloud->global[lVar9]);
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < (int)uVar5) {
    pRVar2 = ref_cloud->global;
    uVar10 = uVar4;
    do {
      pRVar2[uVar10] = pRVar2[uVar10 - 1];
      uVar10 = uVar10 - 1;
    } while ((long)uVar8 < (long)uVar10);
    if ((int)uVar7 < (int)uVar5) {
      uVar7 = ref_cloud->naux;
      do {
        if (0 < (int)uVar7) {
          pRVar3 = ref_cloud->aux;
          uVar10 = 0;
          do {
            pRVar3[uVar4 * (long)(int)uVar7 + uVar10] =
                 pRVar3[(uVar4 - 1) * (long)(int)uVar7 + uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        uVar4 = uVar4 - 1;
      } while ((long)uVar8 < (long)uVar4);
      goto LAB_001fddcb;
    }
  }
  uVar7 = ref_cloud->naux;
LAB_001fddcb:
  ref_cloud->n = uVar5 + 1;
  ref_cloud->global[uVar8] = global;
  if (0 < (int)uVar7) {
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    pRVar3 = ref_cloud->aux;
    uVar8 = 0;
    do {
      pRVar3[iVar6 * uVar7 + uVar8] = aux[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_store(REF_CLOUD ref_cloud, REF_GLOB global,
                                   REF_DBL *aux) {
  REF_INT item, i, insert_point;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  insert_point = 0;
  for (item = ref_cloud_n(ref_cloud) - 1; item >= 0; item--) {
    if (ref_cloud_global(ref_cloud, item) == global) { /* replace aux */
      each_ref_cloud_aux(ref_cloud, i) {
        ref_cloud_aux(ref_cloud, i, item) = aux[i];
      }
      return REF_SUCCESS;
    }
    if (ref_cloud_global(ref_cloud, item) < global) {
      insert_point = item + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    ref_cloud_global(ref_cloud, item) = ref_cloud_global(ref_cloud, item - 1);
  }
  for (item = ref_cloud_n(ref_cloud); item > insert_point; item--) {
    each_ref_cloud_aux(ref_cloud, i) {
      ref_cloud_aux(ref_cloud, i, item) = ref_cloud_aux(ref_cloud, i, item - 1);
    }
  }
  /* fill insert_point */
  ref_cloud_n(ref_cloud)++;
  item = insert_point;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}